

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O1

Matrix4x4 * CMU462::operator*(Matrix4x4 *__return_storage_ptr__,double c,Matrix4x4 *A)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  Matrix4x4 *cA;
  
  __return_storage_ptr__->entries[3].z = 0.0;
  __return_storage_ptr__->entries[3].w = 0.0;
  __return_storage_ptr__->entries[3].x = 0.0;
  __return_storage_ptr__->entries[3].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  __return_storage_ptr__->entries[2].w = 0.0;
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[1].w = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[0].w = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  dVar9 = A->entries[0].x * c;
  dVar10 = A->entries[0].y * c;
  auVar1._8_4_ = SUB84(dVar10,0);
  auVar1._0_8_ = dVar9;
  auVar1._12_4_ = (int)((ulong)dVar10 >> 0x20);
  __return_storage_ptr__->entries[0].x = dVar9;
  __return_storage_ptr__->entries[0].y = (double)auVar1._8_8_;
  dVar9 = A->entries[0].z * c;
  dVar10 = A->entries[0].w * c;
  auVar2._8_4_ = SUB84(dVar10,0);
  auVar2._0_8_ = dVar9;
  auVar2._12_4_ = (int)((ulong)dVar10 >> 0x20);
  __return_storage_ptr__->entries[0].z = dVar9;
  __return_storage_ptr__->entries[0].w = (double)auVar2._8_8_;
  dVar9 = A->entries[1].x * c;
  dVar10 = A->entries[1].y * c;
  auVar3._8_4_ = SUB84(dVar10,0);
  auVar3._0_8_ = dVar9;
  auVar3._12_4_ = (int)((ulong)dVar10 >> 0x20);
  __return_storage_ptr__->entries[1].x = dVar9;
  __return_storage_ptr__->entries[1].y = (double)auVar3._8_8_;
  dVar9 = A->entries[1].z * c;
  dVar10 = A->entries[1].w * c;
  auVar4._8_4_ = SUB84(dVar10,0);
  auVar4._0_8_ = dVar9;
  auVar4._12_4_ = (int)((ulong)dVar10 >> 0x20);
  __return_storage_ptr__->entries[1].z = dVar9;
  __return_storage_ptr__->entries[1].w = (double)auVar4._8_8_;
  dVar9 = A->entries[2].x * c;
  dVar10 = A->entries[2].y * c;
  auVar5._8_4_ = SUB84(dVar10,0);
  auVar5._0_8_ = dVar9;
  auVar5._12_4_ = (int)((ulong)dVar10 >> 0x20);
  __return_storage_ptr__->entries[2].x = dVar9;
  __return_storage_ptr__->entries[2].y = (double)auVar5._8_8_;
  dVar9 = A->entries[2].z * c;
  dVar10 = A->entries[2].w * c;
  auVar6._8_4_ = SUB84(dVar10,0);
  auVar6._0_8_ = dVar9;
  auVar6._12_4_ = (int)((ulong)dVar10 >> 0x20);
  __return_storage_ptr__->entries[2].z = dVar9;
  __return_storage_ptr__->entries[2].w = (double)auVar6._8_8_;
  dVar9 = A->entries[3].x * c;
  dVar10 = A->entries[3].y * c;
  auVar7._8_4_ = SUB84(dVar10,0);
  auVar7._0_8_ = dVar9;
  auVar7._12_4_ = (int)((ulong)dVar10 >> 0x20);
  __return_storage_ptr__->entries[3].x = dVar9;
  __return_storage_ptr__->entries[3].y = (double)auVar7._8_8_;
  dVar9 = A->entries[3].z * c;
  dVar10 = A->entries[3].w * c;
  auVar8._8_4_ = SUB84(dVar10,0);
  auVar8._0_8_ = dVar9;
  auVar8._12_4_ = (int)((ulong)dVar10 >> 0x20);
  __return_storage_ptr__->entries[3].z = dVar9;
  __return_storage_ptr__->entries[3].w = (double)auVar8._8_8_;
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 operator*( double c, const Matrix4x4& A ) {

    Matrix4x4 cA;
    const double* Aij = (const double*) &A;
    double* cAij = (double*) &cA;

    *cAij++ = c * (*Aij++);//0
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//4
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//8
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//12
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);
    *cAij++ = c * (*Aij++);//15
	//16
    return cA;
  }